

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

osfildef * bif_get_file(bifcxdef *ctx,int *fnump,int *bin_modep)

{
  long lVar1;
  runcxdef *ctx_00;
  uint *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  long fnum;
  undefined8 in_stack_ffffffffffffffd8;
  runcxdef *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  ctx_00 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  if (((-1 < (long)ctx_00) && ((long)ctx_00 < 10)) &&
     (*(long *)(in_RDI + 0x30 + (long)ctx_00 * 0x10) != 0)) {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = (int)ctx_00;
    }
    if (in_RDX != (uint *)0x0) {
      *in_RDX = (uint)((*(uint *)(in_RDI + (long)ctx_00 * 0x10 + 0x38) & 1) != 0);
    }
    return *(osfildef **)(in_RDI + 0x30 + (long)ctx_00 * 0x10);
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(ctx_00,(int)((ulong)ctx_00 >> 0x20));
}

Assistant:

static osfildef *bif_get_file(bifcxdef *ctx, int *fnump, int *bin_modep)
{
    long fnum;

    /* get the file number and make sure it's valid */
    fnum = runpopnum(ctx->bifcxrun);
    if (fnum < 0 || fnum >= BIFFILMAX || ctx->bifcxfile[fnum].fp == 0)
        runsig(ctx->bifcxrun, ERR_BADFILE);

    /* put the validated file number, if the caller wants it */
    if (fnump != 0)
        *fnump = (int)fnum;

    /* set the binary-mode flag, if the caller wants it */
    if (bin_modep != 0)
        *bin_modep = ((ctx->bifcxfile[fnum].flags & BIFFIL_F_BINARY) != 0);

    /* return the file array pointer */
    return ctx->bifcxfile[fnum].fp;
}